

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::concat<char[3]>(path *this,char (*x) [3])

{
  string *in_RDI;
  path p;
  format in_stack_ffffffffffffffc4;
  char (*in_stack_ffffffffffffffc8) [3];
  path *in_stack_ffffffffffffffd0;
  
  path<char[3],ghc::filesystem::path>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xffffffffffffffd0);
  postprocess_path_with_format(this,x._4_4_);
  ~path((path *)0x20470d);
  return (path *)in_RDI;
}

Assistant:

inline path& path::concat(const Source& x)
{
    path p(x);
    _path += p._path;
    postprocess_path_with_format(native_format);
    return *this;
}